

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float128 float128_scalbn_mips64(float128 a,int n,float_status *status)

{
  flag zSign;
  uint64_t zSig1;
  uint64_t aSig1;
  uint64_t aSig0;
  int32_t aExp;
  flag aSign;
  float_status *status_local;
  int n_local;
  float128 a_local;
  
  zSig1 = extractFloat128Frac1(a);
  aSig1 = extractFloat128Frac0(a);
  aSig0._0_4_ = extractFloat128Exp(a);
  zSign = extractFloat128Sign(a);
  if ((int32_t)aSig0 == 0x7fff) {
    unique0x1000018e = a;
    if (aSig1 != 0 || zSig1 != 0) {
      join_0x00000010_0x00000000_ = propagateFloat128NaN(a,a,status);
    }
  }
  else {
    if ((int32_t)aSig0 == 0) {
      if ((aSig1 == 0) && (zSig1 == 0)) {
        return a;
      }
      aSig0._0_4_ = 1;
    }
    else {
      aSig1 = aSig1 | 0x1000000000000;
    }
    if (n < 0x10001) {
      status_local._4_4_ = n;
      if (n < -0x10000) {
        status_local._4_4_ = -0x10000;
      }
    }
    else {
      status_local._4_4_ = 0x10000;
    }
    join_0x00000010_0x00000000_ =
         normalizeRoundAndPackFloat128
                   (zSign,status_local._4_4_ + -1 + (int32_t)aSig0,aSig1,zSig1,status);
  }
  return stack0xffffffffffffffe8;
}

Assistant:

float128 float128_scalbn(float128 a, int n, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig0, aSig1;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    if ( aExp == 0x7FFF ) {
        if ( aSig0 | aSig1 ) {
            return propagateFloat128NaN(a, a, status);
        }
        return a;
    }
    if (aExp != 0) {
        aSig0 |= UINT64_C(0x0001000000000000);
    } else if (aSig0 == 0 && aSig1 == 0) {
        return a;
    } else {
        aExp++;
    }

    if (n > 0x10000) {
        n = 0x10000;
    } else if (n < -0x10000) {
        n = -0x10000;
    }

    aExp += n - 1;
    return normalizeRoundAndPackFloat128( aSign, aExp, aSig0, aSig1
                                         , status);

}